

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

PrimitiveInstanceSymbol *
slang::ast::anon_unknown_292::createPrimInst
          (Compilation *compilation,Scope *scope,PrimitiveSymbol *primitive,
          HierarchicalInstanceSyntax *syntax,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<unsigned_int> *path)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  type *ptVar3;
  PrimitiveInstanceSymbol *this;
  undefined4 extraout_var;
  HierarchicalInstanceSyntax *in_RCX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDI;
  SmallVectorBase<unsigned_int> *in_stack_00000008;
  PrimitiveInstanceSymbol *result;
  type *loc;
  type *name;
  span<unsigned_int,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  PrimitiveSymbol *in_stack_ffffffffffffff88;
  SourceLocation *in_stack_ffffffffffffff90;
  Scope *in_stack_ffffffffffffff98;
  BumpAllocator *in_stack_ffffffffffffffa0;
  
  anon_unknown.dwarf_af8249::getNameLoc(in_RCX);
  _Var2._M_extent_value =
       (size_t)std::
               get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                           *)0x60beff);
  ptVar3 = std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                       *)0x60bf0e);
  this = BumpAllocator::
         emplace<slang::ast::PrimitiveInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::PrimitiveSymbol_const&>
                   (in_stack_ffffffffffffffa0,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  iVar1 = SmallVectorBase<unsigned_int>::copy(in_stack_00000008,in_RDI,src);
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_18446744073709551615UL>
            ((span<const_unsigned_int,_18446744073709551615UL> *)CONCAT44(extraout_var,iVar1),
             in_stack_ffffffffffffff78);
  (this->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)in_stack_ffffffffffffff90;
  (this->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value =
       (size_t)in_stack_ffffffffffffff98;
  Symbol::setSyntax((Symbol *)this,&in_RCX->super_SyntaxNode);
  syntax_00._M_extent._M_extent_value = _Var2._M_extent_value;
  syntax_00._M_ptr = (pointer)ptVar3;
  Symbol::setAttributes((Symbol *)this,in_stack_ffffffffffffff98,syntax_00);
  return this;
}

Assistant:

PrimitiveInstanceSymbol* createPrimInst(Compilation& compilation, const Scope& scope,
                                        const PrimitiveSymbol& primitive,
                                        const HierarchicalInstanceSyntax& syntax,
                                        std::span<const AttributeInstanceSyntax* const> attributes,
                                        SmallVectorBase<uint32_t>& path) {
    auto [name, loc] = getNameLoc(syntax);
    auto result = compilation.emplace<PrimitiveInstanceSymbol>(name, loc, primitive);
    result->arrayPath = path.copy(compilation);
    result->setSyntax(syntax);
    result->setAttributes(scope, attributes);
    return result;
}